

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O3

void __thiscall
Sequence::process_cluster_list1
          (Sequence *this,shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *hdr1,
          shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *cluster1,
          shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *cluster2,
          shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> *LargeL,int iter,int eqtype,
          Eqclass_S *parent)

{
  int *piVar1;
  shared_ptr<Itemset> *psVar2;
  Env *seqstrm;
  element_type *peVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  element_type *peVar7;
  pointer piVar8;
  Lists<std::shared_ptr<Eqclass>_> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  Eqclass_S *parent_00;
  element_type *peVar10;
  uint uVar11;
  ulong uVar12;
  shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *psVar13;
  Sequence *pSVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  Eqclass_S EQ;
  Itemset_S local_108;
  Itemset_S local_f8;
  int msup;
  int esup;
  int lsup;
  Itemset_S mjoin;
  shared_ptr<Eqclass> local_a8;
  Eqclass_S local_98;
  Itemset_S local_88;
  Itemset_S local_78;
  Env *local_68;
  element_type *peStack_60;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  
  parent_00 = parent;
  seqstrm = this->env;
  local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                iter + -1);
  EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_50 = (element_type *)LargeL;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Eqclass,std::allocator<Eqclass>,int,int&>
            (&EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount,(Eqclass **)&EQ
             ,(allocator<Eqclass> *)&local_108,(int *)&local_f8,&eqtype);
  fill_seq_template(&EQ,parent_00,2);
  local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar3 = (cluster2->
           super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar4 = (peVar3->theHead).
           super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var5 = (peVar3->theHead).
           super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  uVar12 = (ulong)(iter + -1);
  while (p_Var9 = p_Var5, peVar4 != (element_type *)0x0) {
    peVar6 = (hdr1->
             super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar11 = Eqclass::templ(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    psVar2 = &peVar4->theItem;
    prune_decision((Sequence *)&stack0xffffffffffffff98,(Itemset_S *)this,psVar2,(int)peVar6 + 0x10,
                   uVar11);
    _Var15._M_pi = local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
    local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_68;
    local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_60;
    if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
    }
    _Var15._M_pi = local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
    local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((element_type *)_Var15._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
    }
    _Var15._M_pi = mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
    }
    msup = 0;
    esup = 0;
    lsup = 0;
    if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            pruning_type) {
      uVar11 = Eqclass::templ(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      pre_pruning(this,&local_f8,uVar11,
                  &((hdr1->
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->theItem,psVar2,'\x01');
    }
    if (((Env *)local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (Env *)0x0) &&
       (pSVar14 = this,
       get_tmpnewf_intersect
                 (this,&local_f8,&local_108,&mjoin,&lsup,&esup,&msup,psVar2,
                  &((hdr1->
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->theItem,iter),
       (Env *)local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (Env *)0x0)
       ) {
      fill_join(pSVar14,&local_f8,
                &((hdr1->
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->theItem,psVar2);
    }
    if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            pruning_type) {
      uVar11 = Eqclass::templ(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      post_pruning(this,&local_f8,uVar11);
    }
    peVar10 = local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((Env *)local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (Env *)0x0
       ) {
      peVar7 = (this->numLargeItemset).
               super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      piVar8 = (peVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(peVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar8 >> 2) <= uVar12) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar12);
      }
      piVar1 = piVar8 + uVar12;
      *piVar1 = *piVar1 + 1;
      if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          outputfreq != '\0') {
        uVar11 = Eqclass::templ(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        Itemset::print_seq(peVar10,(ostream *)seqstrm,uVar11);
      }
      local_78.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_78.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Eqclass::append(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_78);
      if (local_78.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
    }
    peVar6 = (peVar4->theNext).
             super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var5 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(peVar4->theNext).
                     super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
             + 8))->_M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
    peVar4 = peVar6;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
    }
  }
  peVar4 = (hdr1->
           super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar6 = (peVar4->theNext).
           super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var5 = (peVar4->theNext).
           super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
  }
  while (p_Var9 = p_Var5, peVar6 != (element_type *)0x0) {
    peVar4 = (hdr1->
             super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar11 = Eqclass::templ2(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    psVar2 = &peVar6->theItem;
    prune_decision((Sequence *)&stack0xffffffffffffff98,(Itemset_S *)this,psVar2,(int)peVar4 + 0x10,
                   uVar11);
    _Var15._M_pi = local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
    local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_68;
    local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_60;
    if ((element_type *)_Var15._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
    }
    _Var15._M_pi = local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
    local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
    }
    _Var15._M_pi = mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
    }
    msup = 0;
    esup = 0;
    lsup = 0;
    if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            pruning_type) {
      uVar11 = Eqclass::templ2(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      pre_pruning(this,&local_108,uVar11,
                  &((hdr1->
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->theItem,psVar2,'\0');
    }
    if (((Env *)local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (Env *)0x0) &&
       (pSVar14 = this,
       get_tmpnewf_intersect
                 (this,&local_f8,&local_108,&mjoin,&lsup,&esup,&msup,psVar2,
                  &((hdr1->
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->theItem,iter),
       (Env *)local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (Env *)0x0
       )) {
      fill_join(pSVar14,&local_108,
                &((hdr1->
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->theItem,psVar2);
    }
    if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            pruning_type) {
      uVar11 = Eqclass::templ2(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      post_pruning(this,&local_108,uVar11);
    }
    peVar10 = local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((Env *)local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (Env *)0x0) {
      peVar7 = (this->numLargeItemset).
               super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      piVar8 = (peVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(peVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar8 >> 2) <= uVar12) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar12);
      }
      piVar1 = piVar8 + uVar12;
      *piVar1 = *piVar1 + 1;
      if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          outputfreq != '\0') {
        uVar11 = Eqclass::templ2(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        Itemset::print_seq(peVar10,(ostream *)seqstrm,uVar11);
      }
      local_88.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_88.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((element_type *)
          local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((string *)
                    &(local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count)->_M_dataplus)._M_p =
               *(int *)&(((string *)
                         &(local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((string *)
                    &(local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count)->_M_dataplus)._M_p =
               *(int *)&(((string *)
                         &(local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p + 1;
        }
      }
      Eqclass::append2(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_88);
      if ((element_type *)
          local_88.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
    }
    peVar4 = (peVar6->theNext).
             super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var5 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(peVar6->theNext).
                     super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
             + 8))->_M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
    peVar6 = peVar4;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
    }
  }
  if (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (Eqclass *)0x0)
  goto LAB_00110510;
  psVar13 = Eqclass::list(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((((psVar13->super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->theSize < 1) &&
     (psVar13 = Eqclass::list2(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr),
     ((psVar13->super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
     _M_ptr)->theSize < 1)) {
LAB_001104e5:
    _Var15._M_pi = EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        recursive != 0) {
      local_98.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_98.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      process_cluster1(this,&local_98,
                       (shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> *)&stack0xffffffffffffffb8,
                       iter + 1);
      if ((element_type *)_Stack_40._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
      }
      if (local_98.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      goto LAB_001104e5;
    }
    this_00 = ((__shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2> *)
              &local_50->args)->_M_ptr;
    local_a8.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_a8.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
             = (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        UNLOCK();
      }
      else {
        (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
             = (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
      }
    }
    Lists<std::shared_ptr<Eqclass>_>::append(this_00,&local_a8);
    _Var15._M_pi = local_a8.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
  }
  if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
  }
LAB_00110510:
  if (mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((element_type *)
      local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
  }
  return;
}

Assistant:

void Sequence::process_cluster_list1(shared_ptr<ListNodes<shared_ptr<Itemset>>>& hdr1,
                                     shared_ptr<Lists<shared_ptr<Itemset>>>& cluster1,
                                     shared_ptr<Lists<shared_ptr<Itemset>>>& cluster2,
                                     shared_ptr<Lists<Eqclass_S>>& LargeL,
                                     int iter, int eqtype, Eqclass_S& parent) {

    ostringstream &logger = env.logger;
    ostringstream &seqstrm = env.seqstrm;

    shared_ptr<ListNodes<shared_ptr<Itemset>>> hdr2;
    Eqclass_S EQ = make_shared<Eqclass>(iter - 1, eqtype);
    fill_seq_template(EQ, parent, 2);

    Itemset_S ljoin, ejoin, mjoin;
    int lsup, esup, msup;
    hdr2 = cluster2->head();
    for (; hdr2; hdr2 = hdr2->next()) {
        //ljoin = (Itemset_S )1;
        ljoin = prune_decision(hdr2->item(), hdr1->item(), EQ->templ(), LJOIN);
        ejoin = nullptr;
        mjoin = nullptr;
        lsup = esup = msup = 0;
        if (args->pruning_type > 1)
            pre_pruning(ljoin, EQ->templ(), hdr1->item(), hdr2->item(), 1);
        if (ljoin) get_tmpnewf_intersect(ljoin, ejoin, mjoin, lsup, esup, msup, hdr2->item(), hdr1->item(), iter);
        if (ljoin) fill_join(ljoin, hdr1->item(), hdr2->item());
        if (args->pruning_type > 1) {
            post_pruning(ljoin, EQ->templ());
        }
        if (ljoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(ljoin, hdr1->item(), hdr2->item());
            if (args->outputfreq) ljoin->print_seq(seqstrm, EQ->templ());
            EQ->append(ljoin);
        }
    }

    //hdr2 = cluster1->head();
    //for (; hdr2 != hdr1; hdr2=hdr2->next()){
    hdr2 = hdr1->next();
    for (; hdr2 != nullptr; hdr2 = hdr2->next()) {
        //ejoin = (Itemset_S )1;
        ejoin = prune_decision(hdr2->item(), hdr1->item(), EQ->templ2(), EJOIN);
        ljoin = nullptr;
        mjoin = nullptr;
        lsup = esup = msup = 0;
        if (args->pruning_type > 1)
            pre_pruning(ejoin, EQ->templ2(), hdr1->item(), hdr2->item(), 0);
        if (ejoin) get_tmpnewf_intersect(ljoin, ejoin, mjoin, lsup, esup, msup, hdr2->item(), hdr1->item(), iter);
        if (ejoin) fill_join(ejoin, hdr1->item(), hdr2->item());
        if (args->pruning_type > 1) post_pruning(ejoin, EQ->templ2());
        if (ejoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(ejoin, hdr1->item(), hdr2->item());
            if (args->outputfreq) ejoin->print_seq(seqstrm, EQ->templ2());
            EQ->append2(ejoin);
        }
    }

    if (EQ) {
        if ((EQ->list()->size() > 0) || (EQ->list2()->size() > 0)) {
            if (args->recursive) {
                //if (use_hash) insert_freqarray(EQ);
                process_cluster1(EQ, nullptr, iter + 1);
                EQ = nullptr;
            } else LargeL->append(EQ);
        } else {
            EQ = nullptr;
        }
    }
}